

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ssse3.c
# Opt level: O0

void randomx_argon2_fill_segment_ssse3(argon2_instance_t *instance,argon2_position_t position)

{
  uint32_t uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  argon2_instance_t *in_RDI;
  __m128i state [64];
  uint32_t i;
  uint32_t starting_index;
  uint32_t curr_offset;
  uint32_t prev_offset;
  uint64_t ref_lane;
  uint64_t ref_index;
  uint64_t pseudo_rand;
  block input_block;
  block address_block;
  block *curr_block;
  block *ref_block;
  undefined1 auStackY_c58 [1032];
  uint local_850;
  uint local_84c;
  uint local_848;
  uint local_844;
  ulong local_840;
  ulong local_838;
  ulong local_830;
  int in_stack_fffffffffffff854;
  block *in_stack_fffffffffffff858;
  block *in_stack_fffffffffffff860;
  __m128i *in_stack_fffffffffffff868;
  argon2_position_t local_10;
  
  if (in_RDI != (argon2_instance_t *)0x0) {
    local_84c = 0;
    local_10.pass = (uint32_t)in_RSI;
    local_10.slice = (uint8_t)in_RDX;
    if ((local_10.pass == 0) && (local_10.slice == 0)) {
      local_84c = 2;
    }
    local_10.lane = SUB84(in_RSI,4);
    local_848 = local_10.lane * in_RDI->lane_length + (uint)local_10.slice * in_RDI->segment_length
                + local_84c;
    local_844 = local_848;
    if (local_848 % in_RDI->lane_length == 0) {
      local_844 = local_848 + in_RDI->lane_length;
    }
    local_844 = local_844 - 1;
    local_10._0_8_ = in_RSI;
    local_10._8_8_ = in_RDX;
    memcpy(auStackY_c58,in_RDI->memory + local_844,0x400);
    for (local_850 = local_84c; local_850 < in_RDI->segment_length; local_850 = local_850 + 1) {
      if (local_848 % in_RDI->lane_length == 1) {
        local_844 = local_848 - 1;
      }
      local_830 = in_RDI->memory[local_844].v[0];
      local_840 = (local_830 >> 0x20) % (ulong)in_RDI->lanes;
      if ((local_10.pass == 0) && (local_10.slice == '\0')) {
        local_840 = (ulong)local_10.lane;
      }
      local_10.index = local_850;
      uVar1 = randomx_argon2_index_alpha
                        (in_RDI,&local_10,(uint32_t)local_830,(uint)(local_840 == local_10.lane));
      local_838 = (ulong)uVar1;
      if (in_RDI->version == 0x10) {
        fill_block(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                   in_stack_fffffffffffff854);
      }
      else if (local_10.pass == 0) {
        fill_block(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                   in_stack_fffffffffffff854);
      }
      else {
        fill_block(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
                   in_stack_fffffffffffff854);
      }
      local_848 = local_848 + 1;
      local_844 = local_844 + 1;
    }
  }
  return;
}

Assistant:

void randomx_argon2_fill_segment_ssse3(const argon2_instance_t* instance,
	argon2_position_t position) {
	block* ref_block = NULL, * curr_block = NULL;
	block address_block, input_block;
	uint64_t pseudo_rand, ref_index, ref_lane;
	uint32_t prev_offset, curr_offset;
	uint32_t starting_index, i;
	__m128i state[ARGON2_OWORDS_IN_BLOCK];

	if (instance == NULL) {
		return;
	}

	starting_index = 0;

	if ((0 == position.pass) && (0 == position.slice)) {
		starting_index = 2; /* we have already generated the first two blocks */
	}

	/* Offset of the current block */
	curr_offset = position.lane * instance->lane_length +
		position.slice * instance->segment_length + starting_index;

	if (0 == curr_offset % instance->lane_length) {
		/* Last block in this lane */
		prev_offset = curr_offset + instance->lane_length - 1;
	}
	else {
		/* Previous block */
		prev_offset = curr_offset - 1;
	}

	memcpy(state, ((instance->memory + prev_offset)->v), ARGON2_BLOCK_SIZE);

	for (i = starting_index; i < instance->segment_length;
		++i, ++curr_offset, ++prev_offset) {
		/*1.1 Rotating prev_offset if needed */
		if (curr_offset % instance->lane_length == 1) {
			prev_offset = curr_offset - 1;
		}

		/* 1.2 Computing the index of the reference block */
		/* 1.2.1 Taking pseudo-random value from the previous block */
		pseudo_rand = instance->memory[prev_offset].v[0];

		/* 1.2.2 Computing the lane of the reference block */
		ref_lane = ((pseudo_rand >> 32)) % instance->lanes;

		if ((position.pass == 0) && (position.slice == 0)) {
			/* Can not reference other lanes yet */
			ref_lane = position.lane;
		}

		/* 1.2.3 Computing the number of possible reference block within the
		 * lane.
		 */
		position.index = i;
		ref_index = randomx_argon2_index_alpha(instance, &position, pseudo_rand & 0xFFFFFFFF,
			ref_lane == position.lane);

		/* 2 Creating a new block */
		ref_block =
			instance->memory + instance->lane_length * ref_lane + ref_index;
		curr_block = instance->memory + curr_offset;
		if (ARGON2_VERSION_10 == instance->version) {
			/* version 1.2.1 and earlier: overwrite, not XOR */
			fill_block(state, ref_block, curr_block, 0);
		}
		else {
			if (0 == position.pass) {
				fill_block(state, ref_block, curr_block, 0);
			}
			else {
				fill_block(state, ref_block, curr_block, 1);
			}
		}
	}
}